

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void ngai_get_first_last_indices(Integer g_a)

{
  short sVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  global_array_t *pgVar5;
  global_array_t *pgVar6;
  uint uVar7;
  Integer IVar8;
  Integer node;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  C_Integer CVar15;
  ulong uVar16;
  int _ndim_4;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  int _ndim;
  Integer id;
  Integer _hi [7];
  Integer _lo [7];
  Integer index [7];
  Integer hi [7];
  Integer lo [7];
  Integer map_offset [7];
  Integer subscript [7];
  int _index [7];
  long local_330;
  long local_328;
  Integer local_320;
  long local_318;
  ulong local_310;
  long local_308;
  int local_2fc;
  long local_2f8 [7];
  long alStack_2c0 [9];
  Integer local_278 [8];
  Integer local_238 [8];
  Integer local_1f8 [8];
  long alStack_1b8 [7];
  long alStack_180 [9];
  int local_138 [66];
  
  pgVar6 = GA;
  lVar23 = g_a + 1000;
  sVar1 = GA[lVar23].ndim;
  lVar20 = (long)sVar1;
  if (lVar20 < 1) {
    lVar22 = 1;
  }
  else {
    lVar22 = 1;
    lVar13 = 0;
    do {
      lVar22 = lVar22 * GA[g_a + 1000].dims[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar20 != lVar13);
  }
  if (((long)GA[g_a + 1000].p_handle < 0) || (PGRP_LIST[GA[g_a + 1000].p_handle].mirrored == 0)) {
    if (sVar1 < 1) {
      return;
    }
    pgVar5 = GA + lVar23;
    lVar23 = 0;
    do {
      pgVar6[g_a + 1000].first[lVar23] = 0;
      pgVar6[g_a + 1000].last[lVar23] = -1;
      pgVar5->shm_length = -1;
      lVar23 = lVar23 + 1;
    } while (lVar20 != lVar23);
    return;
  }
  local_2fc = GA_Default_Proc_Group;
  GA_Default_Proc_Group = -1;
  local_320 = g_a;
  IVar8 = pnga_cluster_nnodes();
  node = pnga_cluster_nodeid();
  local_310 = pnga_cluster_nprocs(node);
  lVar13 = node * lVar22;
  if (node != IVar8 + -1) {
    lVar22 = (long)((double)((node + 1) * lVar22) / (double)IVar8);
  }
  if (0 < sVar1) {
    lVar9 = 0;
    do {
      alStack_1b8[lVar9] = 0;
      if (lVar9 != 0) {
        lVar14 = alStack_1b8[lVar9];
        lVar18 = 0;
        do {
          lVar14 = lVar14 + GA[g_a + 1000].nblock[lVar18];
          lVar18 = lVar18 + 1;
        } while (lVar9 != lVar18);
        alStack_1b8[lVar9] = lVar14;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar20);
  }
  local_318 = (long)((double)lVar13 / (double)IVar8);
  local_328 = lVar23 * 0x368;
  local_308 = lVar22;
  if ((long)local_310 < 1) {
    uVar25 = 0xffffffffffffffff;
    uVar17 = 0xffffffffffffffff;
  }
  else {
    uVar17 = 0xffffffffffffffff;
    lVar23 = 0;
    uVar25 = 0xffffffffffffffff;
    uVar16 = 0;
    do {
      pnga_proc_topology(local_320,uVar16,local_278);
      if (sVar1 < 1) {
        lVar22 = 1;
      }
      else {
        lVar22 = 1;
        lVar13 = 0;
        do {
          lVar9 = local_278[lVar13];
          if (lVar9 < (long)GA[g_a + 1000].nblock[lVar13] + -1) {
            lVar14 = alStack_1b8[lVar13] * 8 + *(long *)(GA->name + local_328 + -8);
            lVar9 = *(long *)(lVar14 + 8 + lVar9 * 8) - *(long *)(lVar14 + lVar9 * 8);
          }
          else {
            lVar9 = (GA[g_a + 1000].dims[lVar13] -
                    *(long *)(alStack_1b8[lVar13] * 8 + *(long *)(GA->name + local_328 + -8) +
                             lVar9 * 8)) + 1;
          }
          lVar22 = lVar22 * lVar9;
          lVar13 = lVar13 + 1;
        } while (lVar20 != lVar13);
      }
      lVar23 = lVar23 + lVar22;
      uVar24 = uVar17;
      if ((long)uVar17 < 0) {
        uVar24 = uVar16;
      }
      if (lVar23 <= local_318) {
        uVar24 = uVar17;
      }
      uVar17 = uVar24;
      uVar24 = uVar25;
      if ((long)uVar25 < 0) {
        uVar24 = uVar16;
      }
      if ((long)uVar17 < 0) {
        uVar24 = uVar25;
      }
      if (lVar23 < local_308) {
        uVar24 = uVar25;
      }
      uVar25 = uVar24;
      uVar16 = uVar16 + 1;
    } while (uVar16 != local_310);
  }
  IVar8 = local_320;
  lVar23 = local_328;
  uVar16 = 0;
  if (0 < (long)uVar17) {
    uVar24 = 0;
    do {
      pnga_distribution(IVar8,uVar24,local_1f8,local_238);
      lVar22 = 1;
      if (0 < sVar1) {
        lVar13 = 0;
        do {
          lVar9 = ((local_238[lVar13] - local_1f8[lVar13]) + 1) * lVar22;
          lVar22 = 0;
          if (local_1f8[lVar13] <= local_238[lVar13]) {
            lVar22 = lVar9;
          }
          lVar13 = lVar13 + 1;
        } while (lVar20 != lVar13);
      }
      uVar16 = uVar16 + lVar22;
      uVar24 = uVar24 + 1;
    } while (uVar24 != uVar17);
  }
  local_318 = local_318 - uVar16;
  pnga_distribution(IVar8,uVar17,local_1f8,local_238);
  lVar22 = lVar20 + -1;
  lVar13 = 1;
  if (1 < sVar1) {
    lVar9 = 0;
    do {
      lVar13 = lVar13 * ((local_238[lVar9] - local_1f8[lVar9]) + 1);
      lVar9 = lVar9 + 1;
    } while (lVar22 != lVar9);
  }
  lVar14 = (local_318 / lVar13 + 1) - (ulong)(local_318 % lVar13 == 0);
  lVar13 = *(long *)((long)GA->dims + lVar20 * 8 + lVar23 + -8);
  lVar9 = lVar13 + -1;
  if (lVar14 < lVar13) {
    lVar9 = lVar14;
  }
  pnga_proc_topology(local_320,uVar17,local_278);
  alStack_180[lVar20] = lVar9;
  if (1 < sVar1) {
    memset(alStack_180 + 1,0,lVar20 * 8 - 8);
  }
  IVar8 = local_320;
  pgVar6 = GA;
  if (0 < sVar1) {
    lVar13 = *(long *)(GA->name + lVar23 + -8);
    lVar9 = 0;
    do {
      *(long *)((long)pgVar6->first + lVar9 * 8 + lVar23) =
           alStack_180[lVar9 + 1] +
           *(long *)(lVar13 + alStack_1b8[lVar9] * 8 + local_278[lVar9] * 8);
      lVar9 = lVar9 + 1;
    } while (lVar20 != lVar9);
  }
  if (((long)uVar17 < (long)uVar25) && (uVar16 = 0, 0 < (long)uVar25)) {
    uVar17 = 0;
    do {
      pnga_distribution(IVar8,uVar17,local_1f8,local_238);
      lVar13 = 1;
      if (0 < sVar1) {
        lVar9 = 0;
        do {
          lVar14 = ((local_238[lVar9] - local_1f8[lVar9]) + 1) * lVar13;
          lVar13 = 0;
          if (local_1f8[lVar9] <= local_238[lVar9]) {
            lVar13 = lVar14;
          }
          lVar9 = lVar9 + 1;
        } while (lVar20 != lVar9);
      }
      uVar16 = uVar16 + lVar13;
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar25);
  }
  lVar9 = local_308 + ~uVar16;
  pnga_distribution(IVar8,uVar25,local_1f8,local_238);
  lVar13 = 1;
  if (1 < sVar1) {
    lVar14 = 0;
    do {
      lVar13 = lVar13 * ((local_238[lVar14] - local_1f8[lVar14]) + 1);
      lVar14 = lVar14 + 1;
    } while (lVar22 != lVar14);
  }
  alStack_180[lVar20] = lVar9 / lVar13;
  if (1 < sVar1) {
    lVar13 = 0;
    do {
      alStack_180[lVar13 + 1] = local_238[lVar13] - local_1f8[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar22 != lVar13);
  }
  pnga_proc_topology(IVar8,uVar25,local_278);
  if (0 < sVar1) {
    lVar22 = 0;
    do {
      lVar13 = alStack_180[lVar22 + 1] +
               *(long *)(alStack_1b8[lVar22] * 8 + *(long *)(GA->name + lVar23 + -8) +
                        local_278[lVar22] * 8);
      if (GA[g_a + 1000].dims[lVar22] <= lVar13) {
        lVar13 = GA[g_a + 1000].dims[lVar22];
      }
      GA[g_a + 1000].last[lVar22] = lVar13;
      lVar22 = lVar22 + 1;
    } while (lVar20 != lVar22);
  }
  iVar11 = *(int *)((long)GA->dims + lVar23 + -0x2c);
  uVar7 = iVar11 - 0x3e9;
  if ((uVar7 < 0x10) && ((0x806fU >> (uVar7 & 0x1f) & 1) != 0)) {
    local_318 = *(long *)(&DAT_001b9248 + (ulong)uVar7 * 8);
  }
  else {
    pnga_error("type not supported",(long)iVar11);
    local_318 = 0;
  }
  if (0 < sVar1) {
    memcpy(local_278,GA[g_a + 1000].first,lVar20 * 8);
  }
  pnga_locate(IVar8,local_278,&local_330);
  pgVar6 = GA;
  uVar2 = *(ushort *)((long)GA->dims + lVar23 + -0x30);
  uVar17 = (ulong)(short)uVar2;
  iVar11 = *(int *)((long)GA->block_dims + lVar23 + -4);
  if (iVar11 - 1U < 3) {
    uVar25 = (long)(int)local_330 % *(long *)((long)GA->num_blocks + lVar23);
    local_138[0] = (int)uVar25;
    if (1 < (short)uVar2) {
      uVar25 = uVar25 & 0xffffffff;
      lVar13 = 0;
      lVar22 = local_330;
      do {
        lVar22 = (long)((int)lVar22 - (int)uVar25) / GA[g_a + 1000].num_blocks[lVar13];
        uVar25 = (long)(int)lVar22 % GA[g_a + 1000].num_blocks[lVar13 + 1];
        local_138[lVar13 + 1] = (int)uVar25;
        lVar13 = lVar13 + 1;
      } while ((uVar17 & 0xffffffff) - 1 != lVar13);
    }
    if (0 < (short)uVar2) {
      lVar22 = 0;
      do {
        iVar11 = *(int *)((long)local_138 + lVar22);
        lVar13 = *(long *)((long)GA[g_a + 1000].block_dims + lVar22 * 2);
        *(long *)((long)alStack_2c0 + lVar22 * 2 + 8U) = lVar13 * iVar11 + 1;
        lVar13 = ((long)iVar11 + 1) * lVar13;
        *(long *)((long)local_2f8 + lVar22 * 2) = lVar13;
        lVar9 = *(long *)((long)GA[g_a + 1000].dims + lVar22 * 2);
        if (lVar9 <= lVar13) {
          lVar13 = lVar9;
        }
        *(long *)((long)local_2f8 + lVar22 * 2) = lVar13;
        lVar22 = lVar22 + 4;
      } while ((uVar17 & 0xffffffff) << 2 != lVar22);
    }
  }
  else if (iVar11 == 4) {
    uVar25 = (long)(int)local_330 % *(long *)((long)GA->num_blocks + lVar23);
    local_138[0] = (int)uVar25;
    if (1 < (short)uVar2) {
      uVar25 = uVar25 & 0xffffffff;
      lVar13 = 0;
      lVar22 = local_330;
      do {
        lVar22 = (long)((int)lVar22 - (int)uVar25) / GA[g_a + 1000].num_blocks[lVar13];
        uVar25 = (long)(int)lVar22 % GA[g_a + 1000].num_blocks[lVar13 + 1];
        local_138[lVar13 + 1] = (int)uVar25;
        lVar13 = lVar13 + 1;
      } while ((uVar17 & 0xffffffff) - 1 != lVar13);
    }
    if (0 < (short)uVar2) {
      lVar22 = *(long *)(GA->name + lVar23 + -8);
      lVar13 = 0;
      iVar11 = 0;
      do {
        iVar12 = *(int *)((long)local_138 + lVar13);
        lVar9 = (long)iVar11 + (long)iVar12;
        *(undefined8 *)((long)alStack_2c0 + lVar13 * 2 + 8U) = *(undefined8 *)(lVar22 + lVar9 * 8);
        if ((long)iVar12 < *(long *)((long)GA->num_blocks + lVar13 * 2 + lVar23) + -1) {
          lVar9 = *(long *)(*(long *)(GA->name + lVar23 + -8) + 8 + lVar9 * 8) + -1;
        }
        else {
          lVar9 = *(long *)((long)GA->dims + lVar13 * 2 + lVar23);
        }
        *(long *)((long)local_2f8 + lVar13 * 2) = lVar9;
        iVar11 = iVar11 + *(int *)((long)GA->num_blocks + lVar13 * 2 + lVar23);
        lVar13 = lVar13 + 4;
      } while ((uVar17 & 0xffffffff) << 2 != lVar13);
    }
  }
  else if (iVar11 == 0) {
    lVar22 = *(long *)((long)GA->old_nblock + lVar23 + -0x30);
    if (lVar22 == 0) {
      if ((short)uVar2 < 1) {
        lVar22 = 1;
      }
      else {
        lVar22 = 1;
        uVar25 = 0;
        do {
          lVar22 = lVar22 * GA[g_a + 1000].nblock[uVar25];
          uVar25 = uVar25 + 1;
        } while (uVar17 != uVar25);
      }
      if (local_330 < 0 || lVar22 <= local_330) {
LAB_0015e8ac:
        if (0 < (short)uVar2) {
          memset(alStack_2c0 + 1,0,uVar17 * 8);
LAB_0015e8e0:
          memset(local_2f8,0xff,uVar17 * 8);
        }
      }
      else if (0 < (short)uVar2) {
        lVar22 = *(long *)(GA->name + lVar23 + -8);
        uVar25 = 0;
        lVar9 = 0;
        lVar13 = local_330;
        do {
          lVar18 = (long)GA[g_a + 1000].nblock[uVar25];
          lVar14 = lVar22 + (lVar13 % lVar18) * 8;
          alStack_2c0[uVar25 + 1] = *(undefined8 *)(lVar14 + lVar9 * 8);
          if (lVar13 % lVar18 == lVar18 + -1) {
            CVar15 = GA[g_a + 1000].dims[uVar25];
          }
          else {
            CVar15 = *(long *)(lVar14 + 8 + lVar9 * 8) + -1;
          }
          lVar9 = lVar9 + lVar18;
          local_2f8[uVar25] = CVar15;
          uVar25 = uVar25 + 1;
          lVar13 = lVar13 / lVar18;
        } while (uVar17 != uVar25);
      }
    }
    else if (local_330 < lVar22) {
      if ((short)uVar2 < 1) {
        lVar22 = 1;
      }
      else {
        lVar22 = 1;
        uVar25 = 0;
        do {
          lVar22 = lVar22 * GA[g_a + 1000].nblock[uVar25];
          uVar25 = uVar25 + 1;
        } while (uVar17 != uVar25);
      }
      if ((local_330 < 0) || (lVar22 <= local_330)) goto LAB_0015e8ac;
      if (0 < (short)uVar2) {
        lVar22 = *(long *)(GA->name + lVar23 + -8);
        lVar9 = 0;
        uVar25 = 0;
        lVar13 = local_330;
        do {
          lVar18 = (long)GA[g_a + 1000].nblock[uVar25];
          lVar14 = lVar22 + (lVar13 % lVar18) * 8;
          alStack_2c0[uVar25 + 1] = *(undefined8 *)(lVar14 + lVar9 * 8);
          if (lVar13 % lVar18 == lVar18 + -1) {
            CVar15 = GA[g_a + 1000].dims[uVar25];
          }
          else {
            CVar15 = *(long *)(lVar14 + 8 + lVar9 * 8) + -1;
          }
          lVar9 = lVar9 + lVar18;
          local_2f8[uVar25] = CVar15;
          uVar25 = uVar25 + 1;
          lVar13 = lVar13 / lVar18;
        } while (uVar17 != uVar25);
      }
    }
    else if (0 < (short)uVar2) {
      memset(alStack_2c0 + 1,0,(ulong)uVar2 << 3);
      goto LAB_0015e8e0;
    }
  }
  lVar22 = local_330;
  local_308 = CONCAT44(local_308._4_4_,*(undefined4 *)((long)pgVar6->block_dims + lVar23 + -0x18));
  if (0 < *(short *)((long)GA->dims + lVar23 + -0x30)) {
    lVar13 = 0;
    local_310 = uVar17;
    do {
      if ((GA[g_a + 1000].first[lVar13] < alStack_2c0[lVar13 + 1]) ||
         (local_2f8[lVar13] < GA[g_a + 1000].first[lVar13])) {
        sprintf((char *)local_138,"check subscript failed:%ld not in (%ld:%ld) dim=%d",
                GA[g_a + 1000].first[lVar13]);
        pnga_error((char *)local_138,lVar13);
      }
      lVar13 = lVar13 + 1;
      uVar17 = local_310;
    } while (lVar13 < *(short *)((long)GA->dims + lVar23 + -0x30));
  }
  if ((short)uVar17 < 2) {
    lVar9 = 1;
    lVar13 = 0;
  }
  else {
    lVar9 = 1;
    lVar13 = 0;
    lVar14 = 0;
    do {
      lVar18 = *(long *)((long)GA->width + lVar14 * 8 + lVar23);
      lVar13 = lVar13 + ((lVar18 + *(long *)((long)GA->first + lVar14 * 8 + lVar23)) -
                        alStack_2c0[lVar14 + 1]) * lVar9;
      lVar9 = lVar9 * (((lVar18 * 2 + 1) - alStack_2c0[lVar14 + 1]) + local_2f8[lVar14]);
      lVar14 = lVar14 + 1;
    } while (uVar17 - 1 != lVar14);
  }
  lVar14 = *(long *)((long)GA->width + uVar17 * 8 + lVar23 + 0x30);
  lVar18 = alStack_2c0[uVar17];
  lVar4 = *(long *)((long)GA->width + uVar17 * 8 + lVar23 + -8);
  if ((int)local_308 == 0) {
    lVar22 = (long)PGRP_LIST->inv_map_proc_list[lVar22];
  }
  if (0 < *(long *)((long)GA->old_nblock + lVar23 + -0x30)) {
    lVar22 = *(long *)(*(long *)((long)GA->old_nblock + lVar23 + -0x38) + lVar22 * 8);
  }
  lVar19 = *(long *)(GA->name + lVar23 + -0x10);
  iVar11 = *(int *)((long)GA->dims + lVar23 + -0x18);
  if (0 < sVar1) {
    lVar10 = 0;
    do {
      local_278[lVar10] = GA[g_a + 1000].last[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar20 != lVar10);
  }
  lVar20 = *(long *)(lVar19 + lVar22 * 8);
  pnga_locate(local_320,local_278,&local_330);
  pgVar6 = GA;
  uVar2 = *(ushort *)((long)GA->dims + lVar23 + -0x30);
  uVar17 = (ulong)(short)uVar2;
  iVar12 = *(int *)((long)GA->block_dims + lVar23 + -4);
  if (iVar12 - 1U < 3) {
    uVar25 = (long)(int)local_330 % *(long *)((long)GA->num_blocks + lVar23);
    local_138[0] = (int)uVar25;
    if (1 < (short)uVar2) {
      uVar25 = uVar25 & 0xffffffff;
      lVar22 = 0;
      lVar23 = local_330;
      do {
        lVar23 = (long)((int)lVar23 - (int)uVar25) / GA[g_a + 1000].num_blocks[lVar22];
        uVar25 = (long)(int)lVar23 % GA[g_a + 1000].num_blocks[lVar22 + 1];
        local_138[lVar22 + 1] = (int)uVar25;
        lVar22 = lVar22 + 1;
      } while ((uVar17 & 0xffffffff) - 1 != lVar22);
    }
    if (0 < (short)uVar2) {
      lVar23 = 0;
      do {
        iVar12 = *(int *)((long)local_138 + lVar23);
        lVar22 = *(long *)((long)GA[g_a + 1000].block_dims + lVar23 * 2);
        *(long *)((long)alStack_2c0 + lVar23 * 2 + 8U) = lVar22 * iVar12 + 1;
        lVar22 = ((long)iVar12 + 1) * lVar22;
        *(long *)((long)local_2f8 + lVar23 * 2) = lVar22;
        lVar19 = *(long *)((long)GA[g_a + 1000].dims + lVar23 * 2);
        if (lVar19 <= lVar22) {
          lVar22 = lVar19;
        }
        *(long *)((long)local_2f8 + lVar23 * 2) = lVar22;
        lVar23 = lVar23 + 4;
      } while ((uVar17 & 0xffffffff) << 2 != lVar23);
    }
    goto LAB_0015ee60;
  }
  if (iVar12 == 4) {
    uVar25 = (long)(int)local_330 % *(long *)((long)GA->num_blocks + lVar23);
    local_138[0] = (int)uVar25;
    if (1 < (short)uVar2) {
      uVar25 = uVar25 & 0xffffffff;
      lVar19 = 0;
      lVar22 = local_330;
      do {
        lVar22 = (long)((int)lVar22 - (int)uVar25) / GA[g_a + 1000].num_blocks[lVar19];
        uVar25 = (long)(int)lVar22 % GA[g_a + 1000].num_blocks[lVar19 + 1];
        local_138[lVar19 + 1] = (int)uVar25;
        lVar19 = lVar19 + 1;
      } while ((uVar17 & 0xffffffff) - 1 != lVar19);
    }
    if (0 < (short)uVar2) {
      lVar22 = *(long *)(GA->name + local_328 + -8);
      lVar19 = 0;
      iVar12 = 0;
      do {
        iVar3 = *(int *)((long)local_138 + lVar19);
        lVar10 = (long)iVar12 + (long)iVar3;
        *(undefined8 *)((long)alStack_2c0 + lVar19 * 2 + 8U) = *(undefined8 *)(lVar22 + lVar10 * 8);
        if ((long)iVar3 < *(long *)((long)GA->num_blocks + lVar19 * 2 + lVar23) + -1) {
          lVar10 = *(long *)(*(long *)(GA->name + lVar23 + -8) + 8 + lVar10 * 8) + -1;
        }
        else {
          lVar10 = *(long *)((long)GA->dims + lVar19 * 2 + lVar23);
        }
        *(long *)((long)local_2f8 + lVar19 * 2) = lVar10;
        iVar12 = iVar12 + *(int *)((long)GA->num_blocks + lVar19 * 2 + lVar23);
        lVar19 = lVar19 + 4;
      } while ((uVar17 & 0xffffffff) << 2 != lVar19);
    }
    goto LAB_0015ee60;
  }
  if (iVar12 != 0) goto LAB_0015ee60;
  lVar22 = *(long *)((long)GA->old_nblock + lVar23 + -0x30);
  if (lVar22 == 0) {
    if ((short)uVar2 < 1) {
      lVar22 = 1;
    }
    else {
      lVar22 = 1;
      uVar25 = 0;
      do {
        lVar22 = lVar22 * GA[g_a + 1000].nblock[uVar25];
        uVar25 = uVar25 + 1;
      } while (uVar17 != uVar25);
    }
    if (-1 < local_330 && local_330 < lVar22) {
      if (0 < (short)uVar2) {
        lVar23 = *(long *)(GA->name + lVar23 + -8);
        lVar19 = 0;
        uVar25 = 0;
        lVar22 = local_330;
        do {
          lVar21 = (long)GA[g_a + 1000].nblock[uVar25];
          lVar10 = lVar23 + (lVar22 % lVar21) * 8;
          alStack_2c0[uVar25 + 1] = *(undefined8 *)(lVar10 + lVar19 * 8);
          if (lVar22 % lVar21 == lVar21 + -1) {
            CVar15 = GA[g_a + 1000].dims[uVar25];
          }
          else {
            CVar15 = *(long *)(lVar10 + 8 + lVar19 * 8) + -1;
          }
          lVar19 = lVar19 + lVar21;
          local_2f8[uVar25] = CVar15;
          uVar25 = uVar25 + 1;
          lVar22 = lVar22 / lVar21;
        } while (uVar17 != uVar25);
      }
      goto LAB_0015ee60;
    }
LAB_0015ee28:
    if ((short)uVar2 < 1) goto LAB_0015ee60;
    memset(alStack_2c0 + 1,0,uVar17 * 8);
  }
  else {
    if (local_330 < lVar22) {
      if ((short)uVar2 < 1) {
        lVar22 = 1;
      }
      else {
        lVar22 = 1;
        uVar25 = 0;
        do {
          lVar22 = lVar22 * GA[g_a + 1000].nblock[uVar25];
          uVar25 = uVar25 + 1;
        } while (uVar17 != uVar25);
      }
      if ((-1 < local_330) && (local_330 < lVar22)) {
        if (0 < (short)uVar2) {
          lVar23 = *(long *)(GA->name + lVar23 + -8);
          lVar19 = 0;
          uVar25 = 0;
          lVar22 = local_330;
          do {
            lVar21 = (long)GA[g_a + 1000].nblock[uVar25];
            lVar10 = lVar23 + (lVar22 % lVar21) * 8;
            alStack_2c0[uVar25 + 1] = *(undefined8 *)(lVar10 + lVar19 * 8);
            if (lVar22 % lVar21 == lVar21 + -1) {
              CVar15 = GA[g_a + 1000].dims[uVar25];
            }
            else {
              CVar15 = *(long *)(lVar10 + 8 + lVar19 * 8) + -1;
            }
            lVar19 = lVar19 + lVar21;
            local_2f8[uVar25] = CVar15;
            uVar25 = uVar25 + 1;
            lVar22 = lVar22 / lVar21;
          } while (uVar17 != uVar25);
        }
        goto LAB_0015ee60;
      }
      goto LAB_0015ee28;
    }
    if ((short)uVar2 < 1) goto LAB_0015ee60;
    memset(alStack_2c0 + 1,0,(ulong)uVar2 << 3);
  }
  memset(local_2f8,0xff,uVar17 * 8);
LAB_0015ee60:
  iVar12 = *(int *)((long)pgVar6->block_dims + local_328 + -0x18);
  if (*(short *)((long)GA->dims + local_328 + -0x30) < 1) {
    lVar23 = (long)GA->dims + local_328 + -0x30;
  }
  else {
    uVar25 = 0;
    do {
      if ((GA[g_a + 1000].last[uVar25] < alStack_2c0[uVar25 + 1]) ||
         (local_2f8[uVar25] < GA[g_a + 1000].last[uVar25])) {
        sprintf((char *)local_138,"check subscript failed:%ld not in (%ld:%ld) dim=%d",
                GA[g_a + 1000].last[uVar25],alStack_2c0[uVar25 + 1],local_2f8[uVar25],
                uVar25 & 0xffffffff);
        pnga_error((char *)local_138,uVar25);
      }
      uVar25 = uVar25 + 1;
    } while ((long)uVar25 < (long)*(short *)((long)GA->dims + local_328 + -0x30));
    lVar23 = (long)GA->dims + local_328 + -0x30;
  }
  if ((short)uVar2 < 2) {
    lVar19 = 1;
    lVar22 = 0;
  }
  else {
    lVar19 = 1;
    lVar10 = 0;
    lVar22 = 0;
    do {
      lVar21 = *(long *)(lVar23 + 0xc0 + lVar10 * 8);
      lVar22 = lVar22 + ((lVar21 + *(long *)(lVar23 + 0x130 + lVar10 * 8)) - alStack_2c0[lVar10 + 1]
                        ) * lVar19;
      lVar19 = lVar19 * (((lVar21 * 2 + 1) - alStack_2c0[lVar10 + 1]) + local_2f8[lVar10]);
      lVar10 = lVar10 + 1;
    } while (uVar17 - 1 != lVar10);
  }
  if (iVar12 == 0) {
    local_330 = (long)PGRP_LIST->inv_map_proc_list[local_330];
  }
  if (0 < *(long *)(lVar23 + 0x2a8)) {
    local_330 = *(long *)(*(long *)(lVar23 + 0x2a0) + local_330 * 8);
  }
  *(long *)((long)GA->lo + local_328 + -8) =
       (local_318 - ((((lVar14 - lVar18) + lVar4) * lVar9 + lVar13) * (long)iVar11 + lVar20)) +
       (((*(long *)(lVar23 + 0x128 + uVar17 * 8) - alStack_2c0[uVar17]) +
        *(long *)(lVar23 + 0xb8 + uVar17 * 8)) * lVar19 + lVar22) * (long)*(int *)(lVar23 + 0x18) +
       *(long *)(*(long *)(lVar23 + 0x1e0) + local_330 * 8);
  GA_Default_Proc_Group = local_2fc;
  return;
}

Assistant:

void ngai_get_first_last_indices( Integer g_a)  /* array handle (input) */
{

  Integer  lo[MAXDIM], hi[MAXDIM];
  Integer  nelems, nnodes, inode, nproc;
  Integer  ifirst, ilast, nfirst, nlast, icnt, np;
  Integer  i, j, itmp, ndim, map_offset[MAXDIM];
  /* Integer  icheck; */
  Integer  index[MAXDIM], subscript[MAXDIM];
  Integer  handle = GA_OFFSET + g_a;
  Integer  type, size=0, id;
  /* Integer  grp_id; */
  int Save_default_group;
  char     *fptr, *lptr;

  /* find total number of elements */
  ndim = GA[handle].ndim;
  nelems = 1;
  for (i=0; i<ndim; i++) nelems *= GA[handle].dims[i];

  /* If array is mirrored, evaluate first and last indices */
  if (pnga_is_mirrored(g_a)) {
    /* If default group is not world group, change default group to world group
       temporarily */
    Save_default_group = GA_Default_Proc_Group;
    GA_Default_Proc_Group = -1;
    nnodes = pnga_cluster_nnodes();
    inode = pnga_cluster_nodeid();
    nproc = pnga_cluster_nprocs(inode);
    /* grp_id = GA[handle].p_handle; */
    ifirst = (Integer)((double)(inode*nelems)/((double)nnodes));
    if (inode != nnodes-1) {
      ilast = (Integer)((double)((inode+1)*nelems)/((double)nnodes))-1;
    } else {
      ilast = nelems-1;
    }
    /* ifirst and ilast correspond to offsets in shared memory. Find the
       actual indices of the data elements corresponding to these offsets.
       The map_offset array provides a convenient mechanism for extracting
       the first indices on each processor along each coordinate dimension
       from the mapc array. */
    for (i = 0; i<ndim; i++) {
      map_offset[i] = 0;
      for (j = 0; j<i; j++) {
        map_offset[i] += GA[handle].nblock[j];
      }
    }
    icnt = 0;
    nfirst = -1;
    nlast = -1;
    for (i = 0; i<nproc; i++) {
      /* find block indices corresponding to proc i */
      pnga_proc_topology(g_a, i, index);
      nelems = 1;
      for (j = 0; j<ndim; j++) {
        if (index[j] < GA[handle].nblock[j]-1) {
          
          itmp = ((Integer)GA[handle].mapc[map_offset[j]+index[j]+1]
               - (Integer)GA[handle].mapc[map_offset[j]+index[j]]);
          nelems *= itmp;
        } else {
          itmp = ((Integer)GA[handle].dims[j]
               - (Integer)GA[handle].mapc[map_offset[j]+index[j]] + 1);
          nelems *= itmp;
        }
      }
      icnt += nelems;
      if (icnt-1 >= ifirst && nfirst < 0) {
        nfirst = i;
      }
      if (ilast <= icnt-1 && nfirst >= 0 && nlast < 0) {
        nlast = i;
      }
    }
    /* Adjust indices corresponding to start and end of block of
       shared memory so that it can be decomposed into large
       rectangular blocks of the global array. Start by
       adusting the lower index */
    icnt = 0;
    for (i = 0; i<nfirst; i++) {
      pnga_distribution(g_a, i, lo, hi);
      nelems = 1;
      for (j = 0; j<ndim; j++) {
        if (hi[j] >= lo[j]) {
          nelems *= (hi[j] - lo[j] + 1);
        } else {
          nelems = 0;
        }
      }
      icnt += nelems;
    }
    /* calculate offset in local block of memory */
    ifirst = ifirst - icnt;
    /* find dimensions of data on block nfirst */
    np = nfirst;
    pnga_distribution(g_a, np, lo, hi);
    nelems = 1;
    for (i=0; i<ndim-1; i++) {
      nelems *= (hi[i] - lo[i] + 1);
    }
    if (ifirst%nelems == 0) {
      ifirst = ifirst/nelems;
    } else {
      ifirst = (ifirst-ifirst%nelems)/nelems;
      ifirst++;
    }
    if (ifirst > GA[handle].dims[ndim-1]-1) ifirst=GA[handle].dims[ndim-1]-1;
    /* adjust value of ifirst */
    pnga_proc_topology(g_a, nfirst, index);
    subscript[ndim-1] = ifirst;
    for (i=0; i<ndim-1; i++) {
      subscript[i] = 0;
    }
    /* Finally, evaluate absolute indices of first data point */
    for (i=0; i<ndim; i++) {
      GA[handle].first[i] = GA[handle].mapc[map_offset[i]+index[i]]
                          + (C_Integer)subscript[i];
    }
    /* adjust upper bound. If nlast = nfirst, just use old value of icnt */
    if (nlast > nfirst) {
      icnt = 0;
      for (i = 0; i<nlast; i++) {
        pnga_distribution(g_a, i, lo, hi);
        nelems = 1;
        for (j = 0; j<ndim; j++) {
          if (hi[j] >= lo[j]) {
            nelems *= (hi[j] - lo[j] + 1);
          } else {
            nelems = 0;
          }
        }
        icnt += nelems;
      }
    }
    ilast = ilast - icnt;
    /* find dimensions of data on block nlast */
    np = nlast;
    pnga_distribution(g_a, np, lo, hi);
    nelems = 1;
    for (i=0; i<ndim-1; i++) {
      nelems *= (hi[i] - lo[i] + 1);
    }
    ilast = (ilast-ilast%nelems)/nelems;
    /* adjust value of ilast */
    subscript[ndim-1] = ilast;
    for (i=0; i<ndim-1; i++) {
      subscript[i] = (hi[i] - lo[i]);
    }
    pnga_proc_topology(g_a, nlast, index);
    /*
    icheck = 1;
    for (i=1; i<ndim; i++) {
      if (index[i] < GA[handle].nblock[i]-1) {
        itmp = (Integer)GA[handle].mapc[map_offset[i]+index[i]+1]
             - (Integer)GA[handle].mapc[map_offset[i]+index[i]];
      } else {
        itmp = (Integer)GA[handle].dims[i]
             - (Integer)GA[handle].mapc[map_offset[i]+index[i]] + 1;
      }
      if (subscript[i] < itmp-1) icheck = 0;
      subscript[i] = itmp-1;
    }
    if (!icheck) {
      subscript[0]--;
    } */
    /* Finally, evaluate absolute indices of last data point */
    for (i=0; i<ndim; i++) {
      GA[handle].last[i] = GA[handle].mapc[map_offset[i]+index[i]]
                          + (C_Integer)subscript[i];
      if (GA[handle].last[i] > GA[handle].dims[i]) {
        GA[handle].last[i] = GA[handle].dims[i];
      }
    }
    /* find length of shared memory segment owned by this node. Adjust
     * length, if necessary, to account for gaps in memory between
     * processors */
    type = GA[handle].type;
    switch(type) {
      case C_FLOAT: size = sizeof(float); break;
      case C_DBL: size = sizeof(double); break;
      case C_LONG: size = sizeof(long); break;
      case C_LONGLONG: size = sizeof(long long); break;
      case C_INT: size = sizeof(int); break;
      case C_SCPL: size = 2*sizeof(float); break;
      case C_DCPL: size = 2*sizeof(double); break;
      default: pnga_error("type not supported",type);
    }
    for (i=0; i<ndim; i++) index[i] = (Integer)GA[handle].first[i];
    i = (int)pnga_locate(g_a, index, &id);
    gam_Loc_ptr(id, handle, (Integer)GA[handle].first, &fptr);

    for (i=0; i<ndim; i++) index[i] = (Integer)GA[handle].last[i];
    i = (int)pnga_locate(g_a, index, &id);
    gam_Loc_ptr(id, handle, (Integer)GA[handle].last, &lptr);

    GA[handle].shm_length = (C_Long)(lptr - fptr + size);
    GA_Default_Proc_Group = Save_default_group;
  } else {
    for (i=0; i<ndim; i++) {
      GA[handle].first[i] = 0;
      GA[handle].last[i] = -1;
      GA[handle].shm_length = -1;
    }
  }
}